

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O0

ParquetUUIDTargetType __thiscall
duckdb::ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
          (ParquetUUIDOperator *this,hugeint_t input)

{
  unsigned_long shift_count_1;
  idx_t i_1;
  unsigned_long shift_count;
  idx_t i;
  uint64_t low_bytes;
  uint64_t high_bytes;
  hugeint_t input_local;
  ParquetUUIDTargetType result;
  
  for (i = 0; i < 8; i = i + 1) {
    result.bytes[i] =
         (data_t)((input.lower ^ 0x8000000000000000) >> (('\a' - (char)i) * '\b' & 0x3fU));
  }
  for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
    result.bytes[i_1 + 8] = (data_t)((ulong)this >> (('\a' - (char)i_1) * '\b' & 0x3fU));
  }
  return (ParquetUUIDTargetType)result.bytes;
}

Assistant:

static TGT Operation(SRC input) {
		TGT result;
		uint64_t high_bytes = input.upper ^ (int64_t(1) << 63);
		uint64_t low_bytes = input.lower;
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
			result.bytes[i] = (high_bytes >> shift_count) & 0xFF;
		}
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
			result.bytes[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
		}
		return result;
	}